

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  FileDescriptor *file;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppFVar6;
  string *psVar7;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *output;
  Version *this_00;
  size_type sVar8;
  mapped_type *program;
  string *psVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ZeroCopyOutputStream *output_00;
  SubstituteArg *in_stack_fffffffffffff998;
  undefined1 local_590 [8];
  CodedOutputStream writer;
  SubstituteArg local_540;
  SubstituteArg local_510;
  SubstituteArg local_4e0;
  SubstituteArg local_4b0;
  SubstituteArg local_480;
  SubstituteArg local_450;
  SubstituteArg local_420;
  SubstituteArg local_3f0;
  SubstituteArg local_3c0;
  string local_390;
  CodeGeneratorResponse_File *local_370;
  File *output_file;
  int i_1;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> current_output;
  SubstituteArg local_350;
  SubstituteArg local_320;
  SubstituteArg local_2f0;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  string local_170;
  undefined1 local_150 [8];
  string communicate_error;
  Subprocess subprocess;
  Version *version;
  undefined1 local_110 [4];
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  undefined1 local_d0 [8];
  CodeGeneratorResponse response;
  CodeGeneratorRequest request;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  string *plugin_name_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)&response.error_);
  CodeGeneratorResponse::CodeGeneratorResponse((CodeGeneratorResponse *)local_d0);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    CodeGeneratorRequest::set_parameter((CodeGeneratorRequest *)&response.error_,parameter);
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         *)local_110);
  for (version._4_4_ = 0;
      sVar5 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::size(parsed_files), (ulong)(long)version._4_4_ < sVar5;
      version._4_4_ = version._4_4_ + 1) {
    ppFVar6 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator[](parsed_files,(long)version._4_4_);
    psVar7 = FileDescriptor::name_abi_cxx11_(*ppFVar6);
    CodeGeneratorRequest::add_file_to_generate((CodeGeneratorRequest *)&response.error_,psVar7);
    ppFVar6 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator[](parsed_files,(long)version._4_4_);
    file = *ppFVar6;
    output = CodeGeneratorRequest::mutable_proto_file((CodeGeneratorRequest *)&response.error_);
    GetTransitiveDependencies
              (file,true,true,
               (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)local_110,output);
  }
  this_00 = CodeGeneratorRequest::mutable_compiler_version((CodeGeneratorRequest *)&response.error_)
  ;
  Version::set_major(this_00,3);
  Version::set_minor(this_00,3);
  Version::set_patch(this_00,0);
  Version::set_suffix(this_00,"");
  Subprocess::Subprocess((Subprocess *)((long)&communicate_error.field_2 + 0xc));
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->plugins_,plugin_name);
  if (sVar8 == 0) {
    Subprocess::Start((Subprocess *)((long)&communicate_error.field_2 + 0xc),plugin_name,SEARCH_PATH
                     );
  }
  else {
    program = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->plugins_,plugin_name);
    Subprocess::Start((Subprocess *)((long)&communicate_error.field_2 + 0xc),program,EXACT_NAME);
  }
  std::__cxx11::string::string((string *)local_150);
  bVar1 = Subprocess::Communicate
                    ((Subprocess *)((long)&communicate_error.field_2 + 0xc),
                     (Message *)&response.error_,(Message *)local_d0,(string *)local_150);
  if (bVar1) {
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
              ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)&stack0xfffffffffffffca0,
               (ZeroCopyOutputStream *)0x0);
    for (output_file._4_4_ = 0; iVar3 = output_file._4_4_,
        iVar2 = CodeGeneratorResponse::file_size((CodeGeneratorResponse *)local_d0), iVar3 < iVar2;
        output_file._4_4_ = output_file._4_4_ + 1) {
      local_370 = CodeGeneratorResponse::file((CodeGeneratorResponse *)local_d0,output_file._4_4_);
      CodeGeneratorResponse_File::insertion_point_abi_cxx11_(local_370);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::reset
                  ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                   &stack0xfffffffffffffca0,(ZeroCopyOutputStream *)0x0);
        psVar7 = CodeGeneratorResponse_File::name_abi_cxx11_(local_370);
        psVar9 = CodeGeneratorResponse_File::insertion_point_abi_cxx11_(local_370);
        iVar3 = (*generator_context->_vptr_GeneratorContext[4])(generator_context,psVar7,psVar9);
        internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::reset
                  ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                   &stack0xfffffffffffffca0,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3));
      }
      else {
        CodeGeneratorResponse_File::name_abi_cxx11_(local_370);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::reset
                    ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                     &stack0xfffffffffffffca0,(ZeroCopyOutputStream *)0x0);
          psVar7 = CodeGeneratorResponse_File::name_abi_cxx11_(local_370);
          iVar3 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,psVar7);
          internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::reset
                    ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                     &stack0xfffffffffffffca0,
                     (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3));
        }
        else {
          bVar1 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::operator==
                            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                             &stack0xfffffffffffffca0,(ZeroCopyOutputStream *)0x0);
          if (bVar1) {
            strings::internal::SubstituteArg::SubstituteArg(&local_3c0,plugin_name);
            strings::internal::SubstituteArg::SubstituteArg(&local_3f0);
            strings::internal::SubstituteArg::SubstituteArg(&local_420);
            strings::internal::SubstituteArg::SubstituteArg(&local_450);
            strings::internal::SubstituteArg::SubstituteArg(&local_480);
            strings::internal::SubstituteArg::SubstituteArg(&local_4b0);
            strings::internal::SubstituteArg::SubstituteArg(&local_4e0);
            strings::internal::SubstituteArg::SubstituteArg(&local_510);
            strings::internal::SubstituteArg::SubstituteArg(&local_540);
            strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&writer.had_error_);
            strings::Substitute_abi_cxx11_
                      (&local_390,
                       (strings *)
                       "$0: First file chunk returned by plugin did not specify a file name.",
                       (char *)&local_3c0,&local_3f0,&local_420,&local_450,&local_480,&local_4b0,
                       &local_4e0,&local_510,&local_540,(SubstituteArg *)&writer.had_error_,
                       in_stack_fffffffffffff998);
            std::__cxx11::string::operator=((string *)error,(string *)&local_390);
            std::__cxx11::string::~string((string *)&local_390);
            this_local._7_1_ = false;
            goto LAB_0035e9cb;
          }
        }
      }
      output_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                             &stack0xfffffffffffffca0);
      io::CodedOutputStream::CodedOutputStream((CodedOutputStream *)local_590,output_00);
      psVar7 = CodeGeneratorResponse_File::content_abi_cxx11_(local_370);
      io::CodedOutputStream::WriteString((CodedOutputStream *)local_590,psVar7);
      io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_590);
    }
    CodeGeneratorResponse::error_abi_cxx11_((CodeGeneratorResponse *)local_d0);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar7 = CodeGeneratorResponse::error_abi_cxx11_((CodeGeneratorResponse *)local_d0);
      std::__cxx11::string::operator=((string *)error,(string *)psVar7);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
LAB_0035e9cb:
    current_output.ptr_._4_4_ = 1;
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
              ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)&stack0xfffffffffffffca0);
  }
  else {
    strings::internal::SubstituteArg::SubstituteArg(&local_1a0,plugin_name);
    strings::internal::SubstituteArg::SubstituteArg(&local_1d0,(string *)local_150);
    strings::internal::SubstituteArg::SubstituteArg(&local_200);
    strings::internal::SubstituteArg::SubstituteArg(&local_230);
    strings::internal::SubstituteArg::SubstituteArg(&local_260);
    strings::internal::SubstituteArg::SubstituteArg(&local_290);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_320);
    strings::internal::SubstituteArg::SubstituteArg(&local_350);
    strings::Substitute_abi_cxx11_
              (&local_170,(strings *)"$0: $1",(char *)&local_1a0,&local_1d0,&local_200,&local_230,
               &local_260,&local_290,&local_2c0,&local_2f0,&local_320,&local_350,
               in_stack_fffffffffffff998);
    std::__cxx11::string::operator=((string *)error,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    this_local._7_1_ = false;
    current_output.ptr_._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_150);
  Subprocess::~Subprocess((Subprocess *)((long)&communicate_error.field_2 + 0xc));
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *)local_110);
  CodeGeneratorResponse::~CodeGeneratorResponse((CodeGeneratorResponse *)local_d0);
  CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)&response.error_);
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const string& plugin_name,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;

  // Build the request.
  if (!parameter.empty()) {
    request.set_parameter(parameter);
  }

  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    request.add_file_to_generate(parsed_files[i]->name());
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name for plugins.
                              true,  // Include source code info.
                              &already_seen, request.mutable_proto_file());
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(GOOGLE_PROTOBUF_VERSION / 1000000);
  version->set_minor(GOOGLE_PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(GOOGLE_PROTOBUF_VERSION % 1000);
  version->set_suffix(GOOGLE_PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = strings::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); i++) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      // Open a file for insert.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->OpenForInsert(
          output_file.name(), output_file.insertion_point()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == NULL) {
      *error = strings::Substitute(
        "$0: First file chunk returned by plugin did not specify a file name.",
        plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    return false;
  }

  return true;
}